

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5IndexFreeArray(Fts5Data **ap,int n)

{
  int in_ESI;
  long in_RDI;
  int ii;
  undefined4 local_10;
  
  if (in_RDI != 0) {
    for (local_10 = 0; local_10 < in_ESI; local_10 = local_10 + 1) {
      fts5DataRelease((Fts5Data *)0x28c482);
    }
    sqlite3_free((void *)0x28c499);
  }
  return;
}

Assistant:

static void fts5IndexFreeArray(Fts5Data **ap, int n){
  if( ap ){
    int ii;
    for(ii=0; ii<n; ii++){
      fts5DataRelease(ap[ii]);
    }
    sqlite3_free(ap);
  }
}